

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::Model::~Model(Model *this)

{
  Model *this_local;
  
  ~Model(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

Model::~Model() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.Model)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}